

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint64_t fletcher4(char *key,int len,uint64_t seed)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  long lVar5;
  uint32_t *dataw;
  long lVar6;
  uint *puVar7;
  
  iVar2 = len + 3;
  if (-1 < len) {
    iVar2 = len;
  }
  puVar7 = (uint *)key;
  if (len < 4) {
    lVar4 = 0;
    lVar6 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    lVar6 = 0;
    lVar4 = 0;
    do {
      uVar1 = *puVar7;
      puVar7 = puVar7 + 1;
      seed = seed + uVar1;
      lVar4 = lVar4 + seed;
      lVar6 = lVar6 + lVar4;
      uVar3 = uVar3 + lVar6;
    } while (puVar7 < key + (long)(iVar2 >> 2) * 4);
  }
  if (((len & 3U) != 0) && (puVar7 < key + len)) {
    lVar5 = 0;
    do {
      seed = seed + *(byte *)((long)puVar7 + lVar5);
      lVar4 = lVar4 + seed;
      lVar6 = lVar6 + lVar4;
      uVar3 = uVar3 + lVar6;
      lVar5 = lVar5 + 1;
    } while ((long)(key + len) - (long)puVar7 != lVar5);
  }
  return uVar3;
}

Assistant:

uint64_t
fletcher4(const char *key, int len, uint64_t seed)
{
  uint32_t *dataw = (uint32_t *)key;
  const uint32_t *const endw = &((const uint32_t*)key)[len/4];
  uint64_t A = seed, B = 0, C = 0, D = 0;
  while (dataw < endw) {
    A += *dataw++;
    B += A;
    C += B;
    D += C;
  }
  if (len & 3) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (datac < endc) {
      A += *datac++;
      B += A;
      C += B;
      D += C;
    }
  }
  return D;
}